

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkreplyimpl.cpp
# Opt level: O0

void __thiscall
QNetworkReplyImplPrivate::appendDownstreamData(QNetworkReplyImplPrivate *this,QIODevice *data)

{
  long lVar1;
  QNetworkReplyImpl *pQVar2;
  ulong uVar3;
  QIODevice *in_RSI;
  QNetworkReplyImplPrivate *in_RDI;
  long in_FS_OFFSET;
  QNetworkReplyImpl *q;
  QNetworkReplyImplPrivate *this_00;
  Connection local_38;
  Connection local_30;
  char local_28 [24];
  QNetworkReplyImplPrivate *in_stack_fffffffffffffff0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  pQVar2 = q_func(in_RDI);
  uVar3 = QIODevice::isOpen();
  if ((uVar3 & 1) != 0) {
    if (in_RDI->copyDevice == (QIODevice *)0x0) {
      in_RDI->copyDevice = in_RSI;
      QObject::connect((QObject *)&local_30,(int)pQVar2,(sockaddr *)in_RDI->copyDevice,0x3c0138);
      QMetaObject::Connection::~Connection(&local_30);
      QObject::connect((QObject *)&local_38,(int)pQVar2,(sockaddr *)in_RDI->copyDevice,0x3c4591);
      QMetaObject::Connection::~Connection(&local_38);
      _q_copyReadyRead(in_stack_fffffffffffffff0);
    }
    else {
      QMessageLogger::QMessageLogger
                ((QMessageLogger *)this_00,(char *)in_RSI,(int)((ulong)pQVar2 >> 0x20),
                 (char *)in_RDI);
      QMessageLogger::critical
                (local_28,
                 "QNetworkReplyImpl: copy from QIODevice already in progress -- backend probably needs to be fixed"
                );
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QNetworkReplyImplPrivate::appendDownstreamData(QIODevice *data)
{
    Q_Q(QNetworkReplyImpl);
    if (!q->isOpen())
        return;

    // read until EOF from data
    if (Q_UNLIKELY(copyDevice)) {
        qCritical("QNetworkReplyImpl: copy from QIODevice already in progress -- "
                  "backend probably needs to be fixed");
        return;
    }

    copyDevice = data;
    q->connect(copyDevice, SIGNAL(readyRead()), SLOT(_q_copyReadyRead()));
    q->connect(copyDevice, SIGNAL(readChannelFinished()), SLOT(_q_copyReadChannelFinished()));

    // start the copy:
    _q_copyReadyRead();
}